

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLifetimeTests.cpp
# Opt level: O1

void __thiscall deqp::gls::LifetimeTests::details::LifeTest::testDeleteUsed(LifeTest *this)

{
  CallLogWrapper *this_00;
  pointer pcVar1;
  ostringstream *poVar2;
  RenderContext *pRVar3;
  GLboolean GVar4;
  char cVar5;
  int iVar6;
  deUint32 dVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  TestError *this_01;
  ResultCollector errors;
  CheckedProgram program;
  GLint deleteFlagged;
  CheckedShader fragShader;
  CheckedShader vtxShader;
  ResultCollector local_2d0;
  Program local_2b0;
  undefined1 local_270 [120];
  ios_base local_1f8 [264];
  Shader local_f0;
  Shader local_88;
  
  local_2d0.m_testCtx = (this->super_TestBase).super_TestCase.super_TestNode.m_testCtx;
  local_2d0.m_log = (local_2d0.m_testCtx)->m_log;
  local_2d0.m_result = QP_TEST_RESULT_PASS;
  local_2d0.m_message = "Pass";
  pRVar3 = (this->super_TestBase).m_ctx.m_renderCtx;
  pcVar1 = local_270 + 0x10;
  local_270._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_270,
             "#version 100\nattribute vec2 pos; void main() { gl_Position = vec4(pos.xy, 0.0, 1.0); }\n"
             ,"");
  CheckedShader::CheckedShader
            ((CheckedShader *)&local_88,pRVar3,SHADERTYPE_VERTEX,(string *)local_270);
  if ((pointer)local_270._0_8_ != pcVar1) {
    operator_delete((void *)local_270._0_8_,local_270._16_8_ + 1);
  }
  pRVar3 = (this->super_TestBase).m_ctx.m_renderCtx;
  local_270._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_270,"#version 100\nvoid main() { gl_FragColor = vec4(1.0); }\n","");
  CheckedShader::CheckedShader
            ((CheckedShader *)&local_f0,pRVar3,SHADERTYPE_FRAGMENT,(string *)local_270);
  if ((pointer)local_270._0_8_ != pcVar1) {
    operator_delete((void *)local_270._0_8_,local_270._16_8_ + 1);
  }
  CheckedProgram::CheckedProgram
            ((CheckedProgram *)&local_2b0,(this->super_TestBase).m_ctx.m_renderCtx,local_88.m_shader
             ,local_f0.m_shader);
  local_270._0_8_ = ((this->super_TestBase).m_ctx.m_testCtx)->m_log;
  poVar2 = (ostringstream *)(local_270 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar2,"// Created and linked program ",0x1e);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_270,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base(local_1f8);
  this_00 = &(this->super_TestBase).super_CallLogWrapper;
  glu::CallLogWrapper::glUseProgram(this_00,local_2b0.m_program);
  iVar6 = (*((this->super_TestBase).m_ctx.m_renderCtx)->_vptr_RenderContext[3])();
  dVar7 = (**(code **)(CONCAT44(extraout_var,iVar6) + 0x800))();
  glu::checkError(dVar7,"glUseProgram(programId)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsLifetimeTests.cpp"
                  ,0x35c);
  local_270._0_8_ = ((this->super_TestBase).m_ctx.m_testCtx)->m_log;
  poVar2 = (ostringstream *)(local_270 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"// Deleted program ",0x13);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_270,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base(local_1f8);
  glu::Program::~Program(&local_2b0);
  glu::Shader::~Shader(&local_f0);
  glu::Shader::~Shader(&local_88);
  GVar4 = glu::CallLogWrapper::glIsProgram(this_00,local_2b0.m_program);
  if (GVar4 != '\0') {
    local_270._0_8_ = local_270._0_8_ & 0xffffffff00000000;
    glu::CallLogWrapper::glGetProgramiv(this_00,local_2b0.m_program,0x8b80,(GLint *)local_270);
    if (local_270._0_4_ == 0) {
      ResultCollector::addResult
                (&local_2d0,QP_TEST_RESULT_FAIL,"Program object was not flagged as deleted");
    }
    glu::CallLogWrapper::glUseProgram(this_00,0);
    iVar6 = (*((this->super_TestBase).m_ctx.m_renderCtx)->_vptr_RenderContext[3])();
    dVar7 = (**(code **)(CONCAT44(extraout_var_00,iVar6) + 0x800))();
    glu::checkError(dVar7,"glUseProgram(0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsLifetimeTests.cpp"
                    ,0x367);
    iVar6 = (*((this->super_TestBase).m_ctx.m_renderCtx)->_vptr_RenderContext[3])();
    cVar5 = (**(code **)(CONCAT44(extraout_var_01,iVar6) + 0xc90))(local_2b0.m_program);
    if (cVar5 != '\0') {
      ResultCollector::addResult
                (&local_2d0,QP_TEST_RESULT_FAIL,
                 "Deleted program name still valid after being made non-current");
    }
    ResultCollector::~ResultCollector(&local_2d0);
    return;
  }
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_01,(char *)0x0,"glIsProgram(programId)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsLifetimeTests.cpp"
             ,0x361);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void LifeTest::testDeleteUsed (void)
{
	ResultCollector	errors(getTestContext());
	GLuint			programId = 0;

	{
		CheckedShader	vtxShader	(getRenderContext(),
									 SHADERTYPE_VERTEX, s_vertexShaderSrc);
		CheckedShader	fragShader	(getRenderContext(),
									 SHADERTYPE_FRAGMENT, s_fragmentShaderSrc);
		CheckedProgram	program		(getRenderContext(),
									 vtxShader.getShader(), fragShader.getShader());

		programId = program.getProgram();

		log() << TestLog::Message << "// Created and linked program " << programId
			  << TestLog::EndMessage;
		GLU_CHECK_CALL_ERROR(glUseProgram(programId), gl().getError());

		log() << TestLog::Message << "// Deleted program " << programId
			  << TestLog::EndMessage;
	}
	TCU_CHECK(glIsProgram(programId));
	{
		GLint deleteFlagged = 0;
		glGetProgramiv(programId, GL_DELETE_STATUS, &deleteFlagged);
		errors.check(deleteFlagged != 0, "Program object was not flagged as deleted");
	}
	GLU_CHECK_CALL_ERROR(glUseProgram(0), gl().getError());
	errors.check(!gl().isProgram(programId),
				 "Deleted program name still valid after being made non-current");
}